

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlNodeSetBase(xmlNodePtr cur,xmlChar *uri)

{
  xmlElementType xVar1;
  xmlNsPtr in_RAX;
  xmlChar *pxVar2;
  xmlAttrPtr pxVar3;
  int iVar4;
  xmlNsPtr ns;
  
  iVar4 = -1;
  if (cur != (xmlNodePtr)0x0) {
    xVar1 = cur->type;
    if (xVar1 - XML_ELEMENT_NODE < 2) {
      ns = in_RAX;
      xmlSearchNsByHrefSafe(cur,(xmlChar *)"http://www.w3.org/XML/1998/namespace",&ns);
      if ((ns != (xmlNsPtr)0x0) && (pxVar2 = xmlPathToURI(uri), pxVar2 != (xmlChar *)0x0)) {
        pxVar3 = xmlSetNsProp(cur,ns,"base",pxVar2);
        (*xmlFree)(pxVar2);
        iVar4 = -(uint)(pxVar3 == (xmlAttrPtr)0x0);
      }
    }
    else if ((xVar1 == XML_HTML_DOCUMENT_NODE) || (xVar1 == XML_DOCUMENT_NODE)) {
      if (cur[1].name != (xmlChar *)0x0) {
        (*xmlFree)(cur[1].name);
      }
      if (uri == (xmlChar *)0x0) {
        cur[1].name = (xmlChar *)0x0;
      }
      else {
        pxVar2 = xmlPathToURI(uri);
        cur[1].name = pxVar2;
        if (pxVar2 == (xmlChar *)0x0) {
          return -1;
        }
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int
xmlNodeSetBase(xmlNodePtr cur, const xmlChar* uri) {
    xmlNsPtr ns;
    xmlChar* fixed;

    if (cur == NULL)
        return(-1);
    switch(cur->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    break;
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE: {
	    xmlDocPtr doc = (xmlDocPtr) cur;

	    if (doc->URL != NULL)
		xmlFree((xmlChar *) doc->URL);
	    if (uri == NULL) {
		doc->URL = NULL;
            } else {
		doc->URL = xmlPathToURI(uri);
                if (doc->URL == NULL)
                    return(-1);
            }
	    return(0);
	}
        default:
	    return(-1);
    }

    xmlSearchNsByHrefSafe(cur, XML_XML_NAMESPACE, &ns);
    if (ns == NULL)
	return(-1);
    fixed = xmlPathToURI(uri);
    if (fixed == NULL)
        return(-1);
    if (xmlSetNsProp(cur, ns, BAD_CAST "base", fixed) == NULL) {
        xmlFree(fixed);
        return(-1);
    }
    xmlFree(fixed);

    return(0);
}